

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\x18'>::Print
          (SwitchMixin<(unsigned_char)__x18_> *this,DebugWriter *w,char16 *litbuf)

{
  uint8 i;
  ulong uVar1;
  SwitchCase *this_00;
  
  DebugWriter::EOL(w);
  DebugWriter::Indent(w);
  this_00 = this->cases;
  for (uVar1 = 0; uVar1 < this->numCases; uVar1 = uVar1 + 1) {
    SwitchCase::Print(this_00,w);
    this_00 = this_00 + 1;
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void SwitchMixin<n>::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->EOL();
        w->Indent();
        for (uint8 i = 0; i < numCases; i++)
        {
            cases[i].Print(w);
        }
        w->Unindent();
    }